

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_Dsd6FindSupportOne(Dau_Dsd_t *p,word tCof0,word tCof1,int *pVars,int nVars,int v,int u)

{
  char cVar1;
  int iVar2;
  int iVar3;
  
  if ((p == (Dau_Dsd_t *)0x0) ||
     (cVar1 = p->Cache[pVars[(uint)nVars]][pVars[v]], iVar3 = (int)cVar1, cVar1 == '\0')) {
    iVar2 = Abc_Tt6HasVar(tCof1,v);
    iVar3 = Abc_Tt6HasVar(tCof0,v);
    iVar3 = iVar3 + iVar2 * 2;
    if (p != (Dau_Dsd_t *)0x0) {
      Dau_DsdInsertVarCache(p,pVars[(uint)nVars],pVars[v],iVar3);
    }
  }
  return iVar3;
}

Assistant:

static inline int Dau_Dsd6FindSupportOne( Dau_Dsd_t * p, word tCof0, word tCof1, int * pVars, int nVars, int v, int u )
{
    int Status = p ? Dau_DsdLookupVarCache( p, pVars[v], pVars[u] ) : 0;
    if ( Status == 0 )
    {
        Status = (Abc_Tt6HasVar(tCof1, u) << 1) | Abc_Tt6HasVar(tCof0, u);
        if ( p )
            Dau_DsdInsertVarCache( p, pVars[v], pVars[u], Status );
    }
    return Status;
}